

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataTypeRegister.cpp
# Opt level: O0

bool __thiscall
Rml::TransformFuncRegister::Call
          (TransformFuncRegister *this,String *name,VariantList *arguments,Variant *out_result)

{
  code *pcVar1;
  bool bVar2;
  pointer ppVar3;
  Variant local_80;
  function<Rml::Variant_(const_std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>_&)>
  *local_58;
  DataTransformFunc *transform_func;
  undefined1 local_40 [8];
  const_iterator it;
  Variant *out_result_local;
  VariantList *arguments_local;
  String *name_local;
  TransformFuncRegister *this_local;
  
  it.mInfo = (uint8_t *)out_result;
  _local_40 = robin_hood::detail::
              Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<Rml::Variant_(const_std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>_&)>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&this->transform_functions,name);
  _transform_func =
       robin_hood::detail::
       Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<Rml::Variant_(const_std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>_&)>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(&this->transform_functions);
  bVar2 = robin_hood::detail::
          Table<true,80ul,std::__cxx11::string,std::function<Rml::Variant(std::vector<Rml::Variant,std::allocator<Rml::Variant>>const&)>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
          ::Iter<true>::operator==((Iter<true> *)local_40,(Iter<true> *)&transform_func);
  if (bVar2) {
    this_local._7_1_ = false;
  }
  else {
    ppVar3 = robin_hood::detail::
             Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<Rml::Variant_(const_std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>_&)>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::Iter<true>::operator->((Iter<true> *)local_40);
    local_58 = &ppVar3->second;
    bVar2 = ::std::function::operator_cast_to_bool((function *)local_58);
    if ((!bVar2) &&
       (bVar2 = Assert("RMLUI_ASSERT(transform_func)",
                       "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DataTypeRegister.cpp"
                       ,0x7d), !bVar2)) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    ::std::function<Rml::Variant_(const_std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>_&)>
    ::operator()(&local_80,local_58,arguments);
    Variant::operator=((Variant *)it.mInfo,&local_80);
    Variant::~Variant(&local_80);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool TransformFuncRegister::Call(const String& name, const VariantList& arguments, Variant& out_result) const
{
	auto it = transform_functions.find(name);
	if (it == transform_functions.end())
		return false;

	const DataTransformFunc& transform_func = it->second;
	RMLUI_ASSERT(transform_func);

	out_result = transform_func(arguments);
	return true;
}